

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_2::DeepScanLineOutputFile::DeepScanLineOutputFile
          (DeepScanLineOutputFile *this,OutputPartData *part)

{
  bool bVar1;
  string *__lhs;
  Data *pDVar2;
  ArgExc *this_00;
  stringstream _iex_replace_s;
  
  GenericOutputFile::GenericOutputFile(&this->super_GenericOutputFile);
  (this->super_GenericOutputFile)._vptr_GenericOutputFile =
       (_func_int **)&PTR__DeepScanLineOutputFile_003d3440;
  __lhs = Header::type_abi_cxx11_(&part->header);
  bVar1 = std::operator!=(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )DEEPSCANLINE_abi_cxx11_);
  if (!bVar1) {
    pDVar2 = (Data *)operator_new(0x180);
    Data::Data(pDVar2,part->numThreads);
    this->_data = pDVar2;
    pDVar2->_streamData = part->mutex;
    pDVar2->_deleteStream = false;
    initialize(this,&part->header);
    pDVar2 = this->_data;
    pDVar2->partNumber = part->partNumber;
    pDVar2->lineOffsetsPosition = part->chunkOffsetTablePosition;
    pDVar2->previewPosition = part->previewPosition;
    pDVar2->multipart = part->multipart;
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc
            (this_00,"Can\'t build a DeepScanLineOutputFile from a type-mismatched part.");
  __cxa_throw(this_00,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

DeepScanLineOutputFile::DeepScanLineOutputFile (const OutputPartData* part)
{
    try
    {
        if (part->header.type () != DEEPSCANLINE)
            throw IEX_NAMESPACE::ArgExc (
                "Can't build a DeepScanLineOutputFile from a type-mismatched part.");

        _data                = new Data (part->numThreads);
        _data->_streamData   = part->mutex;
        _data->_deleteStream = false;
        initialize (part->header);
        _data->partNumber          = part->partNumber;
        _data->lineOffsetsPosition = part->chunkOffsetTablePosition;
        _data->previewPosition     = part->previewPosition;
        _data->multipart           = part->multipart;
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        delete _data;

        REPLACE_EXC (
            e,
            "Cannot initialize output part "
            "\"" << part->partNumber
                 << "\". " << e.what ());
        throw;
    }
    catch (...)
    {
        delete _data;
        throw;
    }
}